

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

bool __thiscall
glslang::HlslParseContext::handleOutputGeometry
          (HlslParseContext *this,TSourceLoc *loc,TLayoutGeometry *geometry)

{
  TLayoutGeometry geometry_00;
  TLayoutGeometry TVar1;
  TIntermediate *pTVar2;
  char *pcVar3;
  char *pcVar4;
  _func_int **pp_Var5;
  
  if ((this->super_TParseContextBase).super_TParseVersions.language != EShLangGeometry) {
    return true;
  }
  if (this->parsingEntrypointParameters != true) {
    return true;
  }
  geometry_00 = *geometry;
  if ((geometry_00 < ElgQuads) && ((0x92U >> (geometry_00 & 0x1f) & 1) != 0)) {
    pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    TVar1 = pTVar2->outputPrimitive;
    if (TVar1 == ElgNone) {
      pTVar2->outputPrimitive = geometry_00;
      return true;
    }
    if (TVar1 == geometry_00) {
      return true;
    }
    pcVar3 = TQualifier::getGeometryString(geometry_00);
    pp_Var5 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar4 = "output primitive geometry redefinition";
  }
  else {
    pcVar3 = TQualifier::getGeometryString(geometry_00);
    pp_Var5 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar4 = "cannot apply to \'out\'";
  }
  (*pp_Var5[0x2d])(this,loc,pcVar4,pcVar3,"");
  return false;
}

Assistant:

bool HlslParseContext::handleOutputGeometry(const TSourceLoc& loc, const TLayoutGeometry& geometry)
{
    // If this is not a geometry shader, ignore.  It might be a mixed shader including several stages.
    // Since that's an OK situation, return true for success.
    if (language != EShLangGeometry)
        return true;

    // these can be declared on non-entry-points, in which case they lose their meaning
    if (! parsingEntrypointParameters)
        return true;

    switch (geometry) {
    case ElgPoints:
    case ElgLineStrip:
    case ElgTriangleStrip:
        if (! intermediate.setOutputPrimitive(geometry)) {
            error(loc, "output primitive geometry redefinition", TQualifier::getGeometryString(geometry), "");
            return false;
        }
        break;
    default:
        error(loc, "cannot apply to 'out'", TQualifier::getGeometryString(geometry), "");
        return false;
    }

    return true;
}